

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BytecodeTranslator.cpp
# Opt level: O2

void __thiscall BytecodeTranslator::translate(BytecodeTranslator *this,ifstream *i,ofstream *o)

{
  _Alloc_hider _Var1;
  bool bVar2;
  int iVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  mapped_type_conflict *pmVar5;
  mapped_type *pmVar6;
  unsigned_long uVar7;
  long lVar8;
  int i_1;
  ulong uVar9;
  mapped_type_conflict mVar10;
  uint8_t opcode;
  uint varID;
  float val;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string s;
  string comment;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  vars;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  labels;
  
  std::__cxx11::string::string((string *)&comment,"//",(allocator *)&vars);
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &labels._M_t._M_impl.super__Rb_tree_header._M_header;
  labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  mVar10 = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (((byte)i[*(long *)(*(long *)i + -0x18) + 0x20] & 2) == 0) {
    s._M_dataplus._M_p = (pointer)&s.field_2;
    s._M_string_length = 0;
    s.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)i,(string *)&s);
    _Var1._M_p = s._M_dataplus._M_p;
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<std::unary_negate<std::pointer_to_unary_function<int,int>>>>
                      (s._M_dataplus._M_p,s._M_dataplus._M_p + s._M_string_length,isspace);
    std::__cxx11::string::erase(&s,_Var1._M_p,_Var4._M_current);
    if ((s._M_string_length != 0) &&
       (iVar3 = std::__cxx11::string::compare((ulong)&s,0,(string *)comment._M_string_length),
       iVar3 != 0)) {
      split(&tokens,&s);
      bVar2 = std::operator==(tokens.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,"var");
      if (!bVar2) {
        bVar2 = std::operator==(tokens.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,"label");
        if (bVar2) {
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ::operator[](&labels,tokens.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 1);
          *pmVar5 = mVar10;
        }
        else {
          mVar10 = mVar10 + 1;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tokens);
    }
    std::__cxx11::string::~string((string *)&s);
  }
  std::ios::clear((int)*(long *)(*(long *)i + -0x18) + (int)i);
  mVar10 = 0;
  std::istream::seekg((long)i,_S_beg);
  while (((byte)i[*(long *)(*(long *)i + -0x18) + 0x20] & 2) == 0) {
    s._M_dataplus._M_p = (pointer)&s.field_2;
    s._M_string_length = 0;
    s.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)i,(string *)&s);
    _Var1._M_p = s._M_dataplus._M_p;
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<std::unary_negate<std::pointer_to_unary_function<int,int>>>>
                      (s._M_dataplus._M_p,s._M_dataplus._M_p + s._M_string_length,isspace);
    std::__cxx11::string::erase(&s,_Var1._M_p,_Var4._M_current);
    if ((s._M_string_length != 0) &&
       (iVar3 = std::__cxx11::string::compare((ulong)&s,0,(string *)comment._M_string_length),
       iVar3 != 0)) {
      split(&tokens,&s);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
                             *)op::ops_abi_cxx11_,
                            tokens.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      opcode = *pmVar6;
      if (opcode == op::ASSIGN) {
        std::ostream::write((char *)o,(long)&opcode);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::operator[](&vars,tokens.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1);
        varID = *pmVar5;
        val = std::__cxx11::stof(tokens.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 2,(size_t *)0x0);
        std::ostream::write((char *)o,(long)&varID);
        std::ostream::write((char *)o,(long)&val);
      }
      else if (opcode != op::LABEL) {
        if (opcode == op::GOTO) {
          std::ostream::write((char *)o,(long)&opcode);
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ::operator[](&labels,tokens.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 1);
          varID = *pmVar5;
          std::ostream::write((char *)o,(long)&varID);
        }
        else if (opcode == op::MOV) {
          std::ostream::write((char *)o,(long)&opcode);
          uVar7 = std::__cxx11::stoul(tokens.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1,(size_t *)0x0,10
                                     );
          varID = (uint)uVar7;
          uVar7 = std::__cxx11::stoul(tokens.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 2,(size_t *)0x0,10
                                     );
          val = (float)uVar7;
          std::ostream::write((char *)o,(long)&varID);
          std::ostream::write((char *)o,(long)&val);
        }
        else if (opcode == op::VAR) {
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ::operator[](&vars,tokens.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1);
          *pmVar5 = mVar10;
          mVar10 = mVar10 + 4;
        }
        else if (opcode == op::PUSH) {
          std::ostream::write((char *)o,(long)&opcode);
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ::operator[](&vars,tokens.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1);
          varID = *pmVar5;
          std::ostream::write((char *)o,(long)&varID);
        }
        else if (opcode == op::POP) {
          std::ostream::write((char *)o,(long)&opcode);
          if (0x20 < (ulong)((long)tokens.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)tokens.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)) {
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     ::operator[](&vars,tokens.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 1);
            varID = *pmVar5;
            std::ostream::write((char *)o,(long)&varID);
          }
        }
        else {
          std::ostream::write((char *)o,(long)&opcode);
          lVar8 = 0x20;
          for (uVar9 = 1;
              uVar9 < (ulong)((long)tokens.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)tokens.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar9 = uVar9 + 1) {
            varID = (uint)std::__cxx11::stof((string *)
                                             ((long)&((tokens.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar8),(size_t *)0x0);
            std::ostream::write((char *)o,(long)&varID);
            lVar8 = lVar8 + 0x20;
          }
        }
      }
      if ((opcode != op::VAR) && (opcode != op::LABEL)) {
        std::ostream::write((char *)o,0x1081c8);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tokens);
    }
    std::__cxx11::string::~string((string *)&s);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&labels._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&vars._M_t);
  std::__cxx11::string::~string((string *)&comment);
  return;
}

Assistant:

void BytecodeTranslator::translate(std::ifstream &i, std::ofstream &o) {
#ifdef PRINT_BYTECODE
    std::stringstream ss;
#endif

    std::string comment("//");
    std::map<std::string, unsigned int> vars;
    std::map<std::string, unsigned int> labels;
    unsigned int varOffset = 0;

    unsigned int curOp = 0;
    //read all labels
    while (!i.eof()) {
        std::string s;
        getline(i, s);
        s.erase(s.begin(), std::find_if(s.begin(), s.end(), std::not1(std::ptr_fun<int, int>(std::isspace))));
        if (s.empty() || s.compare(0, comment.size(), comment) == 0) continue;

        std::vector<std::string> tokens = split(s);

        if (tokens[0] == "var")
            continue;
        if (tokens[0] == "label") {
#ifdef BT_DEBUG
            printf("read label %s to OP#%i\n", tokens[1].c_str(), curOp);
#endif
            labels[tokens[1]] = curOp;
            continue;
        }
        curOp++;
    }
    i.clear();
    i.seekg(0, std::ios::beg);

    while (!i.eof()) {
        std::string s;
        getline(i, s);
        s.erase(s.begin(), std::find_if(s.begin(), s.end(), std::not1(std::ptr_fun<int, int>(std::isspace))));
        if (s.empty() || s.compare(0, comment.size(), comment) == 0) continue;
        std::vector<std::string> tokens = split(s);
        uint8_t opcode = op::ops[tokens[0]];

        if (opcode == op::ASSIGN) {
            o.write((char *) &opcode, 1);
            unsigned int varID = vars[tokens[1]];
            float val = std::stof(tokens[2]);
            o.write((char *) &varID, 4);
            o.write((char *) &val, 4);

#ifdef BT_DEBUG
            printf("assign %f -> $%i\n", val, varID);
#endif

#ifdef PRINT_BYTECODE
            ss << std::to_string(opcode) << ' ';
            ss << std::to_string(varID) << ' ';
            ss << std::to_string(varID);
#endif
        } else if (opcode == op::LABEL) {
            //skip
/*            o.write((char *) &opcode, 1);
            o.write((char *) &labels[tokens[1]], 4);
            printf("writing label %i\n", labels[tokens[1]]);*/
        } else if (opcode == op::GOTO) {
            o.write((char *) &opcode, 1);
            unsigned int labelID = labels[tokens[1]];
            o.write((char *) &labelID, 4);

#ifdef BT_DEBUG
            printf("writing goto %i\n", labelID);
#endif

#ifdef PRINT_BYTECODE
            ss << std::to_string(opcode) << ' ';
            ss << std::to_string(labelID);
#endif
        } else if (opcode == op::MOV) {
            o.write((char *) &opcode, 1);
            unsigned int varID1 = (unsigned int) std::stoul(tokens[1]),
                    varID2 = (unsigned int) std::stoul(tokens[2]);
            o.write((char *) &varID1, 4);
            o.write((char *) &varID2, 4);

#ifdef PRINT_BYTECODE
            ss << std::to_string(opcode) << ' ';
            ss << std::to_string(varID1) << ' ';
            ss << std::to_string(varID2);
#endif
        } else if (opcode == op::VAR) {
            vars[tokens[1]] = varOffset;
            varOffset += 4;
        } else if (opcode == op::PUSH) {
            o.write((char *) &opcode, 1);
            unsigned int varID = vars[tokens[1]];
            o.write((char *) &varID, 4);

#ifdef BT_DEBUG
            printf("writing push -> %i\n", varID);
#endif

#ifdef PRINT_BYTECODE
            ss << std::to_string(opcode) << ' ';
            ss << std::to_string(varID);
#endif
        } else if (opcode == op::POP) {
#ifdef PRINT_BYTECODE
            ss << std::to_string(opcode) << ' ';
#endif
            o.write((char *) &opcode, 1);
            if (tokens.size() > 1) {
                unsigned int varID = vars[tokens[1]];
                o.write((char *) &varID, 4);

#ifdef BT_DEBUG
                printf("writing pop -> %i\n", varID);
#endif

#ifdef PRINT_BYTECODE
                ss << std::to_string(varID);
#endif
            }
#ifdef BT_DEBUG
            else printf("writing pop\n");
#endif
        } else {
#ifdef PRINT_BYTECODE
            ss << std::to_string(opcode) << ' ';
#endif
            o.write((char *) &opcode, 1);
            for (int i = 1; i < tokens.size(); i++) {
                float f = std::stof(tokens[i]);
#ifdef PRINT_BYTECODE
                ss << std::to_string(f) << ' ';
#endif
                o.write((char *) &f, 4);
            }
        }
        if (opcode != op::VAR && opcode != op::LABEL) {
#ifdef PRINT_BYTECODE
            ss << '\n';
#endif
            o.write(&lineSeparator, 1);
        }
    }

#ifdef PRINT_BYTECODE
    std::cout << "SS:" << '\n';
    std::cout << ss.str() << '\n';
#endif
}